

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * google::protobuf::internal::PackedEnumParserArg
                 (void *object,char *ptr,ParseContext *ctx,_func_bool_void_ptr_int *is_valid,
                 void *data,InternalMetadataWithArenaLite *metadata,int field_num)

{
  anon_class_40_5_beb31822 add;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  char *in_R9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffcc;
  
  add.is_valid = (_func_bool_void_ptr_int *)in_R8;
  add.object = (void *)in_RCX;
  add.data = in_R9;
  add.metadata._0_4_ = in_stack_00000008;
  add.metadata._4_4_ = in_stack_ffffffffffffffcc;
  add._32_8_ = in_R9;
  pcVar1 = EpsCopyInputStream::
           ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadataWithArenaLite*,int)::__0>
                     ((EpsCopyInputStream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_00000008),
                      in_R9,add);
  return pcVar1;
}

Assistant:

const char* PackedEnumParserArg(void* object, const char* ptr,
                                ParseContext* ctx,
                                bool (*is_valid)(const void*, int),
                                const void* data,
                                InternalMetadataWithArenaLite* metadata,
                                int field_num) {
  return ctx->ReadPackedVarint(
      ptr, [object, is_valid, data, metadata, field_num](uint64 val) {
        if (is_valid(data, val)) {
          static_cast<RepeatedField<int>*>(object)->Add(val);
        } else {
          WriteVarint(field_num, val, metadata->mutable_unknown_fields());
        }
      });
}